

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

CappedArray<char,_8UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,unsigned_short i)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  long lVar6;
  CappedArray<char,_8UL> CVar7;
  uint8_t reverse [7];
  CappedArray<char,_8UL> result;
  ulong uVar5;
  
  result.currentSize = 8;
  if ((int)CONCAT62(in_register_00000032,i) == 0) {
    puVar3 = reverse + 1;
    reverse[0] = '\0';
  }
  else {
    puVar3 = reverse;
    uVar5 = (ulong)i;
    do {
      uVar4 = (uint)uVar5;
      *puVar3 = (char)uVar5 + (char)(uVar5 / 10) * -10;
      puVar3 = puVar3 + 1;
      uVar5 = uVar5 / 10;
    } while (9 < uVar4);
  }
  pcVar1 = result.content;
  pcVar2 = pcVar1;
  if (reverse < puVar3) {
    lVar6 = 0;
    do {
      *pcVar2 = puVar3[lVar6 + -1] + '0';
      pcVar2 = pcVar2 + 1;
      lVar6 = lVar6 + -1;
    } while ((long)reverse - (long)puVar3 != lVar6);
  }
  CVar7.currentSize = (long)pcVar2 - (long)pcVar1;
  CVar7.content[0] = result.content[0];
  CVar7.content[1] = result.content[1];
  CVar7.content[2] = result.content[2];
  CVar7.content[3] = result.content[3];
  CVar7.content[4] = result.content[4];
  CVar7.content[5] = result.content[5];
  CVar7.content[6] = result.content[6];
  CVar7.content[7] = result.content[7];
  return CVar7;
}

Assistant:

inline explicit constexpr CappedArray(size_t s): currentSize(s) {}